

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

bool __thiscall irr::video::COpenGLDriver::genericDriverInit(COpenGLDriver *this)

{
  stringc *this_00;
  undefined1 *this_01;
  IContextManager *pIVar1;
  IAttributes *pIVar2;
  double dVar3;
  int iVar4;
  uchar *c;
  long lVar5;
  char *c_00;
  COpenGLCacheHandler *this_02;
  uint uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  char buf [32];
  vector2df local_38;
  vector2df local_30;
  
  pIVar1 = this->ContextManager;
  if (pIVar1 != (IContextManager *)0x0) {
    *(int *)(&pIVar1->field_0x10 + (long)pIVar1->_vptr_IContextManager[-3]) =
         *(int *)(&pIVar1->field_0x10 + (long)pIVar1->_vptr_IContextManager[-3]) + 1;
  }
  this_00 = &this->Name;
  core::string<char>::operator=(this_00,"OpenGL ");
  c = (uchar *)glGetString(0x1f02);
  core::string<char>::string<unsigned_char>((string<char> *)buf,c);
  ::std::__cxx11::string::append((string *)this_00);
  ::std::__cxx11::string::_M_dispose();
  iVar4 = ::std::__cxx11::string::find((char)this_00,0x20);
  if (iVar4 != -1) {
    core::string<char>::subString((string<char> *)buf,this_00,0,iVar4,false);
    core::string<char>::operator=(this_00,(string<char> *)buf);
    ::std::__cxx11::string::_M_dispose();
  }
  CNullDriver::printVersion(&this->super_CNullDriver);
  lVar5 = glGetString(0x1f01);
  c_00 = (char *)glGetString(0x1f00);
  if (c_00 != (char *)0x0 && lVar5 != 0) {
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::operator=(&this->VendorName,c_00);
  }
  this_01 = &(this->super_CNullDriver).field_0x498;
  COpenGLExtensionHandler::initExtensions
            ((COpenGLExtensionHandler *)this_01,this->ContextManager,(this->Params).Stencilbuffer);
  if (this->CacheHandler != (COpenGLCacheHandler *)0x0) {
    (*(this->CacheHandler->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      )._vptr_COpenGLCoreCacheHandler[1])();
  }
  this_02 = (COpenGLCacheHandler *)operator_new(0xd8);
  COpenGLCacheHandler::COpenGLCacheHandler(this_02,this);
  this->CacheHandler = this_02;
  iVar4 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[2])(this,0x12);
  if ((char)iVar4 == '\0') {
    dVar3 = os::Printer::log((Printer *)"GLSL not available.",
                             (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    uVar7 = SUB84(dVar3,0);
  }
  else {
    uVar6 = *(ushort *)&this->field_0x4d2 / 100;
    snprintf(buf,0x20,"%u.%u",(ulong)(ushort)uVar6,
             (ulong)(uVar6 * -100 + (uint)*(ushort *)&this->field_0x4d2));
    dVar3 = os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    uVar7 = SUB84(dVar3,0);
  }
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])(uVar7,pIVar2,"MaxTextures",(ulong)(byte)this->field_0x6c3);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])(pIVar2,"MaxSupportedTextures",(ulong)(byte)this->field_0x6c3);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxLights",(ulong)(byte)(this->super_CNullDriver).field_0x49a);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxAnisotropy",(ulong)(byte)(this->super_CNullDriver).field_0x49b);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxUserClipPlanes",(ulong)(byte)(this->super_CNullDriver).field_0x49c);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxAuxBuffers",(ulong)(byte)(this->super_CNullDriver).field_0x49d);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])(pIVar2,"MaxMultipleRenderTargets",(ulong)(byte)this->field_0x6c2);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxIndices",(ulong)*(uint *)&(this->super_CNullDriver).field_0x4a0);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxTextureSize",(ulong)*(uint *)&(this->super_CNullDriver).field_0x4a4);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"MaxGeometryVerticesOut",(ulong)*(uint *)&this->field_0x4a8);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[0xd])(*(undefined4 *)&this->field_0x4ac,pIVar2,"MaxTextureLODBias");
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])(pIVar2,"Version",(ulong)*(ushort *)&this->field_0x4d0);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])
            (pIVar2,"ShaderLanguageVersion",(ulong)*(ushort *)&this->field_0x4d2);
  pIVar2 = (this->super_CNullDriver).DriverAttributes;
  (*pIVar2->_vptr_IAttributes[8])(pIVar2,"AntiAlias",(ulong)this->AntiAlias);
  glPixelStorei(0xd05,1);
  core::array<irr::video::COpenGLDriver::SUserClipPlane>::reallocate
            (&this->UserClipPlanes,(uint)(byte)(this->super_CNullDriver).field_0x49c,true);
  for (uVar6 = 0; uVar6 < (byte)(this->super_CNullDriver).field_0x49c; uVar6 = uVar6 + 1) {
    SUserClipPlane::SUserClipPlane((SUserClipPlane *)buf);
    core::array<irr::video::COpenGLDriver::SUserClipPlane>::push_back
              (&this->UserClipPlanes,(SUserClipPlane *)buf);
  }
  for (uVar6 = 0; uVar6 != 7; uVar6 = uVar6 + 1) {
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[6])
              (this,(ulong)uVar6,&core::IdentityMatrix);
  }
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x61])(this);
  if (this->field_0x5d7 == '\x01') {
    glLightModeli(0x81f8,0x81fa);
  }
  glLightModeli(0xb51,1);
  glClearDepth(0);
  glHint(0xc50,0x1102);
  glFrontFace(0x900);
  COpenGLExtensionHandler::extGlProvokingVertex((COpenGLExtensionHandler *)this_01,0x8e4d);
  this->Quad2DVertices[0].Pos.X = -1.0;
  this->Quad2DVertices[0].Pos.Y = 1.0;
  *(undefined8 *)&this->Quad2DVertices[0].Pos.Z = 0;
  this->Quad2DVertices[0].Normal.Y = 0.0;
  this->Quad2DVertices[0].Normal.Z = 0.0;
  this->Quad2DVertices[0].Color = 0xffffffff;
  this->Quad2DVertices[0].TCoords.X = 0.0;
  this->Quad2DVertices[0].TCoords.Y = 1.0;
  this->Quad2DVertices[1].Pos.X = 1.0;
  this->Quad2DVertices[1].Pos.Y = 1.0;
  *(undefined8 *)&this->Quad2DVertices[1].Pos.Z = 0;
  this->Quad2DVertices[1].Normal.Y = 0.0;
  this->Quad2DVertices[1].Normal.Z = 0.0;
  this->Quad2DVertices[1].Color = 0xffffffff;
  this->Quad2DVertices[1].TCoords.X = 1.0;
  this->Quad2DVertices[1].TCoords.Y = 1.0;
  this->Quad2DVertices[2].Pos.X = 1.0;
  this->Quad2DVertices[2].Pos.Y = -1.0;
  *(undefined8 *)&this->Quad2DVertices[2].Pos.Z = 0;
  this->Quad2DVertices[2].Normal.Y = 0.0;
  this->Quad2DVertices[2].Normal.Z = 0.0;
  this->Quad2DVertices[2].Color = 0xffffffff;
  this->Quad2DVertices[2].TCoords.X = 1.0;
  this->Quad2DVertices[2].TCoords.Y = 0.0;
  this->Quad2DVertices[3].Pos.X = -1.0;
  this->Quad2DVertices[3].Pos.Y = -1.0;
  *(undefined8 *)&this->Quad2DVertices[3].Pos.Z = 0;
  this->Quad2DVertices[3].Normal.Y = 0.0;
  this->Quad2DVertices[3].Normal.Z = 0.0;
  this->Quad2DVertices[3].Color = 0xffffffff;
  this->Quad2DVertices[3].TCoords.X = 0.0;
  this->Quad2DVertices[3].TCoords.Y = 0.0;
  createMaterialRenderers(this);
  setRenderStates3DMode(this);
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x38])
            ((this->super_CNullDriver).FogStart,(this->super_CNullDriver).FogEnd,
             (this->super_CNullDriver).FogDensity,this,
             (ulong)(this->super_CNullDriver).FogColor.color,
             (ulong)(this->super_CNullDriver).FogType,(ulong)(this->super_CNullDriver).PixelFog,
             (ulong)(this->super_CNullDriver).RangeFog);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  local_30.X = 0.0;
  local_30.Y = 1.0;
  local_38.X = 1.0;
  local_38.Y = -1.0;
  core::CMatrix4<float>::buildTextureTransform
            (&this->TextureFlipMatrix,0.0,(vector2df *)buf,&local_30,&local_38);
  this->ResetRenderStates = true;
  return true;
}

Assistant:

bool COpenGLDriver::genericDriverInit()
{
	if (ContextManager)
		ContextManager->grab();

	Name = "OpenGL ";
	Name.append(glGetString(GL_VERSION));
	s32 pos = Name.findNext(' ', 7);
	if (pos != -1)
		Name = Name.subString(0, pos);
	printVersion();

	// print renderer information
	const GLubyte *renderer = glGetString(GL_RENDERER);
	const GLubyte *vendor = glGetString(GL_VENDOR);
	if (renderer && vendor) {
		os::Printer::log(reinterpret_cast<const c8 *>(renderer), reinterpret_cast<const c8 *>(vendor), ELL_INFORMATION);
		VendorName = reinterpret_cast<const c8 *>(vendor);
	}

	u32 i;

	// load extensions
	initExtensions(ContextManager, Params.Stencilbuffer);

	// reset cache handler
	delete CacheHandler;
	CacheHandler = new COpenGLCacheHandler(this);

	if (queryFeature(EVDF_ARB_GLSL)) {
		char buf[32];
		const u32 maj = ShaderLanguageVersion / 100;
		snprintf_irr(buf, 32, "%u.%u", maj, ShaderLanguageVersion - maj * 100);
		os::Printer::log("GLSL version", buf, ELL_INFORMATION);
	} else
		os::Printer::log("GLSL not available.", ELL_INFORMATION);
	DriverAttributes->setAttribute("MaxTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxSupportedTextures", (s32)Feature.MaxTextureUnits);
	DriverAttributes->setAttribute("MaxLights", MaxLights);
	DriverAttributes->setAttribute("MaxAnisotropy", MaxAnisotropy);
	DriverAttributes->setAttribute("MaxUserClipPlanes", MaxUserClipPlanes);
	DriverAttributes->setAttribute("MaxAuxBuffers", MaxAuxBuffers);
	DriverAttributes->setAttribute("MaxMultipleRenderTargets", (s32)Feature.MultipleRenderTarget);
	DriverAttributes->setAttribute("MaxIndices", (s32)MaxIndices);
	DriverAttributes->setAttribute("MaxTextureSize", (s32)MaxTextureSize);
	DriverAttributes->setAttribute("MaxGeometryVerticesOut", (s32)MaxGeometryVerticesOut);
	DriverAttributes->setAttribute("MaxTextureLODBias", MaxTextureLODBias);
	DriverAttributes->setAttribute("Version", Version);
	DriverAttributes->setAttribute("ShaderLanguageVersion", ShaderLanguageVersion);
	DriverAttributes->setAttribute("AntiAlias", AntiAlias);

	glPixelStorei(GL_PACK_ALIGNMENT, 1);

	UserClipPlanes.reallocate(MaxUserClipPlanes);
	for (i = 0; i < MaxUserClipPlanes; ++i)
		UserClipPlanes.push_back(SUserClipPlane());

	for (i = 0; i < ETS_COUNT; ++i)
		setTransform(static_cast<E_TRANSFORMATION_STATE>(i), core::IdentityMatrix);

	setAmbientLight(SColorf(0.0f, 0.0f, 0.0f, 0.0f));
#ifdef GL_EXT_separate_specular_color
	if (FeatureAvailable[IRR_EXT_separate_specular_color])
		glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL, GL_SEPARATE_SPECULAR_COLOR);
#endif
	glLightModeli(GL_LIGHT_MODEL_LOCAL_VIEWER, 1);

	// This is a fast replacement for NORMALIZE_NORMALS
	//	if ((Version>101) || FeatureAvailable[IRR_EXT_rescale_normal])
	//		glEnable(GL_RESCALE_NORMAL_EXT);

	glClearDepth(1.0);
	glHint(GL_PERSPECTIVE_CORRECTION_HINT, GL_NICEST);
	glFrontFace(GL_CW);
	// adjust flat coloring scheme to DirectX version
#if defined(GL_ARB_provoking_vertex) || defined(GL_EXT_provoking_vertex)
	extGlProvokingVertex(GL_FIRST_VERTEX_CONVENTION_EXT);
#endif

	// Create built-in 2D quad for 2D rendering (both quads and lines).
	Quad2DVertices[0] = S3DVertex(core::vector3df(-1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 1.0f));
	Quad2DVertices[1] = S3DVertex(core::vector3df(1.0f, 1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 1.0f));
	Quad2DVertices[2] = S3DVertex(core::vector3df(1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(1.0f, 0.0f));
	Quad2DVertices[3] = S3DVertex(core::vector3df(-1.0f, -1.0f, 0.0f), core::vector3df(0.0f, 0.0f, 0.0f), SColor(255, 255, 255, 255), core::vector2df(0.0f, 0.0f));

	// create material renderers
	createMaterialRenderers();

	// set the renderstates
	setRenderStates3DMode();

	// set fog mode
	setFog(FogColor, FogType, FogStart, FogEnd, FogDensity, PixelFog, RangeFog);

	// create matrix for flipping textures
	TextureFlipMatrix.buildTextureTransform(0.0f, core::vector2df(0, 0), core::vector2df(0, 1.0f), core::vector2df(1.0f, -1.0f));

	// We need to reset once more at the beginning of the first rendering.
	// This fixes problems with intermediate changes to the material during texture load.
	ResetRenderStates = true;

	return true;
}